

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O3

size_t coins_tests::InsertCoinsMapEntry
                 (CCoinsMap *map,CoinsCachePair *sentinel,CAmount value,char flags)

{
  byte bVar1;
  _Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> _Var2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>,_bool>
  pVar5;
  CCoinsCacheEntry local_70;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (value == -2) {
    if (flags != -1) {
      __assert_fail("flags == NO_ENTRY",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                    ,0x253,
                    "size_t coins_tests::InsertCoinsMapEntry(CCoinsMap &, CoinsCachePair &, CAmount, char)"
                   );
    }
    uVar4 = 0;
  }
  else {
    if (flags == -1) {
      __assert_fail("flags != NO_ENTRY",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                    ,0x256,
                    "size_t coins_tests::InsertCoinsMapEntry(CCoinsMap &, CoinsCachePair &, CAmount, char)"
                   );
    }
    CCoinsCacheEntry::CCoinsCacheEntry(&local_70);
    Coin::Clear(&local_70.coin);
    if (local_70.coin.out.nValue != -1) {
      __assert_fail("coin.IsSpent()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                    ,0x248,"void coins_tests::SetCoinsValue(CAmount, Coin &)");
    }
    if (value != -1) {
      local_70.coin._40_4_ = local_70.coin._40_4_ & 1 | 2;
      local_70.coin.out.nValue = value;
    }
    pVar5 = std::
            _Hashtable<COutPoint,std::pair<COutPoint_const,CCoinsCacheEntry>,PoolAllocator<std::pair<COutPoint_const,CCoinsCacheEntry>,144ul,8ul>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<COutPoint_const&,CCoinsCacheEntry>
                      ((_Hashtable<COutPoint,std::pair<COutPoint_const,CCoinsCacheEntry>,PoolAllocator<std::pair<COutPoint_const,CCoinsCacheEntry>,144ul,8ul>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)map,OUTPOINT,&local_70);
    _Var2 = pVar5.first.
            super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>._M_cur;
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("inserted.second",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                    ,0x25a,
                    "size_t coins_tests::InsertCoinsMapEntry(CCoinsMap &, CoinsCachePair &, CAmount, char)"
                   );
    }
    bVar1 = *(byte *)((long)_Var2.
                            super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                            ._M_cur + 0x40);
    if ((flags != '\0') && (bVar1 == 0)) {
      *(CoinsCachePair **)
       ((long)_Var2.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
              _M_cur + 0x30) = (sentinel->second).m_prev;
      *(CoinsCachePair **)
       ((long)_Var2.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
              _M_cur + 0x38) = sentinel;
      (sentinel->second).m_prev =
           (CoinsCachePair *)
           ((long)_Var2.
                  super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                  _M_cur + 8);
      *(CoinsCachePair **)
       (*(long *)((long)_Var2.
                        super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                        ._M_cur + 0x30) + 0x30) =
           (CoinsCachePair *)
           ((long)_Var2.
                  super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                  _M_cur + 8);
    }
    *(byte *)((long)_Var2.
                    super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                    _M_cur + 0x40) = bVar1 | flags;
    uVar3 = (ulong)*(uint *)((long)_Var2.
                                   super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                                   ._M_cur + 0x58);
    if (*(uint *)((long)_Var2.
                        super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                        ._M_cur + 0x6c) < 0x1d) {
      uVar3 = 0;
    }
    uVar4 = 0;
    if ((int)uVar3 != 0) {
      uVar4 = uVar3 + 0x1f & 0xfffffffffffffff0;
    }
    if (local_70.m_flags != '\0') {
      ((local_70.m_next)->second).m_prev = local_70.m_prev;
      ((local_70.m_prev)->second).m_next = local_70.m_next;
      local_70.m_flags = '\0';
    }
    if (0x1c < local_70.coin.out.scriptPubKey.super_CScriptBase._size) {
      free(local_70.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

static size_t InsertCoinsMapEntry(CCoinsMap& map, CoinsCachePair& sentinel, CAmount value, char flags)
{
    if (value == ABSENT) {
        assert(flags == NO_ENTRY);
        return 0;
    }
    assert(flags != NO_ENTRY);
    CCoinsCacheEntry entry;
    SetCoinsValue(value, entry.coin);
    auto inserted = map.emplace(OUTPOINT, std::move(entry));
    assert(inserted.second);
    inserted.first->second.AddFlags(flags, *inserted.first, sentinel);
    return inserted.first->second.coin.DynamicMemoryUsage();
}